

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void __thiscall AActor::UpdateRenderSectorList(AActor *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  sector_t *s;
  msecnode_t *pmVar6;
  portnode_t *ppVar7;
  long lVar8;
  FLinePortal *p;
  FLinePortal *s_00;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  uint uVar12;
  double dVar13;
  undefined1 local_48 [24];
  double local_30;
  
  dVar2 = (this->__Pos).X;
  if ((dVar2 == (this->OldRenderPos).X) && (!NAN(dVar2) && !NAN((this->OldRenderPos).X))) {
    dVar2 = (this->__Pos).Y;
    pdVar1 = &(this->OldRenderPos).Y;
    if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
      dVar2 = (this->__Pos).Z;
      pdVar1 = &(this->OldRenderPos).Z;
      if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
        return;
      }
    }
  }
  if (((this->flags).Value & 8) == 0) {
    ClearRenderLineList(this);
    if (PortalBlockmap.containsLines == true) {
      dVar2 = (this->__Pos).X;
      dVar3 = (this->__Pos).Y;
      if ((((dVar2 != (this->OldRenderPos).X) || (NAN(dVar2) || NAN((this->OldRenderPos).X))) ||
          (pdVar1 = &(this->OldRenderPos).Y, dVar3 != *pdVar1)) || (NAN(dVar3) || NAN(*pdVar1))) {
        uVar11 = (uint)((dVar2 - bmaporgx) * 0.0078125);
        uVar12 = (uint)((dVar3 - bmaporgy) * 0.0078125);
        dVar13 = this->radius * 1.5;
        if (128.0 <= dVar13) {
          dVar13 = 128.0;
        }
        local_48._0_8_ = dVar3 + dVar13;
        local_30 = dVar2 + dVar13;
        local_48._16_4_ = SUB84(dVar2 - dVar13,0);
        local_48._8_8_ = dVar3 - dVar13;
        local_48._20_4_ = (int)((ulong)(dVar2 - dVar13) >> 0x20);
        if (((-1 < (int)(uVar12 | uVar11)) && ((int)uVar11 < bmapwidth)) &&
           (((int)uVar12 < bmapheight &&
            (PortalBlockmap.data.Array[(int)(uVar12 * PortalBlockmap.dx + uVar11)].
             neighborContainsLines == true)))) {
          s_00 = linePortals.Array;
          for (lVar8 = (ulong)linePortals.Count * 0x48; lVar8 != 0; lVar8 = lVar8 + -0x48) {
            if (((s_00->mType != '\0') &&
                (bVar4 = FBoundingBox::inRange((FBoundingBox *)local_48,s_00->mOrigin), bVar4)) &&
               (iVar5 = FBoundingBox::BoxOnLineSide((FBoundingBox *)local_48,s_00->mOrigin),
               iVar5 != 0)) {
              ppVar7 = P_AddPortalnode(s_00,this,this->render_portallist);
              this->render_portallist = ppVar7;
            }
            s_00 = s_00 + 1;
          }
        }
      }
    }
    s = this->Sector;
    ClearRenderSectorList(this);
    uVar9 = 0xe0000000;
    uVar10 = 0xc7efffff;
    while ((s->planes[1].Flags & 0x1d0U) == 0x100) {
      dVar2 = sectorPortals.Array[s->Portals[1]].mPlaneZ;
      if ((dVar2 <= (double)CONCAT44(uVar10,uVar9)) ||
         ((this->__Pos).Z + this->Height + 64.0 < dVar2)) break;
      local_48._0_8_ = sectorPortals.Array[s->Portals[1]].mDisplacement.X + (this->__Pos).X;
      local_48._8_8_ = sectorPortals.Array[s->Portals[1]].mDisplacement.Y + (this->__Pos).Y;
      s = P_PointInSector((DVector2 *)local_48);
      pmVar6 = P_AddSecnode(s,this,this->render_sectorlist,&s->render_thinglist);
      this->render_sectorlist = pmVar6;
      uVar9 = SUB84(dVar2,0);
      uVar10 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    uVar9 = 0xe0000000;
    uVar10 = 0x47efffff;
    while ((s->planes[0].Flags & 0x1d0U) == 0x100) {
      dVar2 = sectorPortals.Array[s->Portals[0]].mPlaneZ;
      if ((double)CONCAT44(uVar10,uVar9) <= dVar2) {
        return;
      }
      if (dVar2 < (this->__Pos).Z + -64.0) {
        return;
      }
      local_48._0_8_ = sectorPortals.Array[s->Portals[0]].mDisplacement.X + (this->__Pos).X;
      local_48._8_8_ = sectorPortals.Array[s->Portals[0]].mDisplacement.Y + (this->__Pos).Y;
      s = P_PointInSector((DVector2 *)local_48);
      pmVar6 = P_AddSecnode(s,this,this->render_sectorlist,&s->render_thinglist);
      this->render_sectorlist = pmVar6;
      uVar9 = SUB84(dVar2,0);
      uVar10 = (undefined4)((ulong)dVar2 >> 0x20);
    }
  }
  return;
}

Assistant:

void AActor::UpdateRenderSectorList()
{
	static const double SPRITE_SPACE = 64.;
	if (Pos() != OldRenderPos && !(flags & MF_NOSECTOR))
	{
		// Only check if the map contains line portals
		ClearRenderLineList();
		if (PortalBlockmap.containsLines && Pos().XY() != OldRenderPos.XY())
		{
			int bx = GetBlockX(X());
			int by = GetBlockY(Y());
			FBoundingBox bb(X(), Y(), MIN(radius*1.5, 128.));	// Don't go further than 128 map units, even for large actors
			// Are there any portals near the actor's position?
			if (bx >= 0 && by >= 0 && bx < bmapwidth && by < bmapheight && PortalBlockmap(bx, by).neighborContainsLines)
			{
				// Go through the entire list. In most cases this is faster than setting up a blockmap iterator
				for (auto &p : linePortals)
				{
					if (p.mType == PORTT_VISUAL) continue;
					if (bb.inRange(p.mOrigin) && bb.BoxOnLineSide(p.mOrigin))
					{
						render_portallist = P_AddPortalnode(&p, this, render_portallist);
					}
				}
			}
		}
		sector_t *sec = Sector;
		double lasth = -FLT_MAX;
		ClearRenderSectorList();
		while (!sec->PortalBlocksMovement(sector_t::ceiling))
		{
			double planeh = sec->GetPortalPlaneZ(sector_t::ceiling);
			if (planeh <= lasth) break;	// broken setup.
			if (Top() + SPRITE_SPACE < planeh) break;
			lasth = planeh;
			DVector2 newpos = Pos() + sec->GetPortalDisplacement(sector_t::ceiling);
			sec = P_PointInSector(newpos);
			render_sectorlist = P_AddSecnode(sec, this, render_sectorlist, sec->render_thinglist);
		}
		lasth = FLT_MAX;
		while (!sec->PortalBlocksMovement(sector_t::floor))
		{
			double planeh = sec->GetPortalPlaneZ(sector_t::floor);
			if (planeh >= lasth) break;	// broken setup.
			if (Z() - SPRITE_SPACE > planeh) break;
			lasth = planeh;
			DVector2 newpos = Pos() + sec->GetPortalDisplacement(sector_t::floor);
			sec = P_PointInSector(newpos);
			render_sectorlist = P_AddSecnode(sec, this, render_sectorlist, sec->render_thinglist);
		}
	}
}